

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

Var Js::TypedArrayBase::CreateNewInstanceFromIterator
              (RecyclableObject *iterator,ScriptContext *scriptContext,uint32 elementSize,
              PFNCreateTypedArray pfnCreateTypedArray)

{
  uint uVar1;
  TempGuestArenaAllocatorObject *tempGuestAllocator;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this;
  ArrayBuffer *pAVar2;
  long *plVar3;
  Type *ppvVar4;
  uint index;
  
  tempGuestAllocator = ScriptContext::GetTemporaryGuestAllocator(scriptContext,L"Runtime");
  this = IteratorToList(iterator,scriptContext,&tempGuestAllocator->allocator);
  uVar1 = (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
  if ((int)((ulong)uVar1 * (ulong)elementSize >> 0x20) == 0) {
    pAVar2 = JavascriptLibrary::CreateArrayBuffer
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                        (uint32)((ulong)uVar1 * (ulong)elementSize));
    index = 0;
    plVar3 = (long *)(*pfnCreateTypedArray)
                               (&pAVar2->super_ArrayBufferBase,0,uVar1,
                                (scriptContext->super_ScriptContextBase).javascriptLibrary);
    if (uVar1 != 0) {
      do {
        ppvVar4 = JsUtil::
                  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this,index);
        (**(code **)(*plVar3 + 0x148))(plVar3,index,*ppvVar4,0);
        index = index + 1;
      } while (uVar1 != index);
    }
    ScriptContext::ReleaseTemporaryGuestAllocator(scriptContext,tempGuestAllocator);
    return plVar3;
  }
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec24,(PCWSTR)0x0);
}

Assistant:

Var TypedArrayBase::CreateNewInstanceFromIterator(RecyclableObject *iterator, ScriptContext *scriptContext, uint32 elementSize, PFNCreateTypedArray pfnCreateTypedArray)
    {
        TypedArrayBase *newArr = nullptr;

        DECLARE_TEMP_GUEST_ALLOCATOR(tempAlloc);

        ACQUIRE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"));
        {
            JsUtil::List<Var, ArenaAllocator>* tempList = IteratorToList(iterator, scriptContext, tempAlloc);

            uint32 len = tempList->Count();
            uint32 byteLen;

            if (UInt32Math::Mul(len, elementSize, &byteLen))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidTypedArrayLength);
            }

            ArrayBufferBase *arrayBuffer = scriptContext->GetLibrary()->CreateArrayBuffer(byteLen);
            newArr = static_cast<TypedArrayBase*>(pfnCreateTypedArray(arrayBuffer, 0, len, scriptContext->GetLibrary()));

            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = tempList->Item(k);
                newArr->SetItem(k, kValue);
            }
        }
        RELEASE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext);

        return newArr;
    }